

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O0

void slang::iterDirectory
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,GlobMode mode)

{
  bool bVar1;
  byte bVar2;
  directory_entry *this;
  int in_EDX;
  path *in_RSI;
  directory_iterator it;
  error_code ec;
  error_code *in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  path *in_stack_ffffffffffffff80;
  format in_stack_ffffffffffffffc7;
  char (*in_stack_ffffffffffffffc8) [2];
  path *in_stack_ffffffffffffffd0;
  
  std::error_code::error_code((error_code *)in_stack_ffffffffffffff70);
  bVar1 = std::filesystem::__cxx11::path::empty((path *)0x3c19b5);
  if (bVar1) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  }
  else {
    std::filesystem::__cxx11::path::path
              (in_stack_ffffffffffffff80,
               (path *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  }
  std::filesystem::operator|(follow_directory_symlink,skip_permission_denied);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)in_stack_ffffffffffffff80,
             (path *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (directory_options)((ulong)in_stack_ffffffffffffff70 >> 0x38),in_stack_ffffffffffffff68
            );
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff70);
  do {
    memset(&stack0xffffffffffffff80,0,0x10);
    std::filesystem::__cxx11::directory_iterator::directory_iterator((directory_iterator *)0x3c1a32)
    ;
    bVar2 = std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)in_stack_ffffffffffffff70,
                       (directory_iterator *)in_stack_ffffffffffffff68);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x3c1a4f);
    if ((bVar2 & 1) == 0) {
      std::filesystem::__cxx11::directory_iterator::~directory_iterator
                ((directory_iterator *)0x3c1a61);
      return;
    }
    if (in_EDX == 0) {
      std::filesystem::__cxx11::directory_iterator::operator->((directory_iterator *)0x3c1a97);
      bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file
                        ((directory_entry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (!bVar1) goto LAB_003c1aa8;
LAB_003c1acf:
      in_stack_ffffffffffffff70 = in_RSI;
      this = std::filesystem::__cxx11::directory_iterator::operator->
                       ((directory_iterator *)0x3c1ae6);
      std::filesystem::__cxx11::directory_entry::path(this);
      SmallVectorBase<std::filesystem::__cxx11::path>::
      emplace_back<std::filesystem::__cxx11::path_const&>
                ((SmallVectorBase<std::filesystem::__cxx11::path> *)
                 CONCAT17(bVar2,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
    }
    else {
LAB_003c1aa8:
      if (in_EDX == 1) {
        std::filesystem::__cxx11::directory_iterator::operator->((directory_iterator *)0x3c1abc);
        bVar1 = std::filesystem::__cxx11::directory_entry::is_directory
                          ((directory_entry *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (bVar1) goto LAB_003c1acf;
      }
    }
    std::filesystem::__cxx11::directory_iterator::increment((error_code *)&stack0xffffffffffffffc8);
  } while( true );
}

Assistant:

static void iterDirectory(const fs::path& path, SmallVector<fs::path>& results, GlobMode mode) {
    std::error_code ec;
    for (auto it = fs::directory_iterator(path.empty() ? "." : path,
                                          fs::directory_options::follow_directory_symlink |
                                              fs::directory_options::skip_permission_denied,
                                          ec);
         it != fs::directory_iterator(); it.increment(ec)) {
        if ((mode == GlobMode::Files && it->is_regular_file(ec)) ||
            (mode == GlobMode::Directories && it->is_directory(ec))) {
            results.emplace_back(it->path());
        }
    }
}